

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

void __thiscall Function::call(Function *this)

{
  long in_RSI;
  
  call(this,(ValueList *)(in_RSI + -8));
  return;
}

Assistant:

ptr<Value> call(ValueList& arguments) override {
        if(!owner)
            throw ThrowPacket(ExceptionObjects::null_value("Function owner not set"));

        if(arguments.size() != parameters -> size())
            throw ThrowPacket(ExceptionObjects::call_failed("Invalid number of arguments"));

        Environment localEnv = *(owner -> getEnvironment());

        for(int i = 0; i < arguments.size(); i++)
            localEnv.putValue((*parameters)[i], Scope::Public, arguments[i], false);

        try {
            statementBlock -> execute(&localEnv);
        } catch(ptr<Value> value) {
            return value;
        }

        return nullptr;
    }